

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O2

ByteArray * __thiscall ByteArray::operator=(ByteArray *this,ByteArray *other)

{
  free(this->data_);
  this->data_ = (byte *)0x0;
  this->size_ = 0;
  this->allocatedSize_ = 0;
  append(this,other);
  return this;
}

Assistant:

ByteArray& ByteArray::operator=(ByteArray& other)
{
	free(data_);
	data_ = NULL;
	size_ = allocatedSize_ = 0;
	append(other);

	return *this;
}